

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui.cpp
# Opt level: O0

void ImGui::CalcListClipping
               (int items_count,float items_height,int *out_items_display_start,
               int *out_items_display_end)

{
  ImGuiWindow *pIVar1;
  int mn;
  int iVar2;
  int local_40;
  int local_3c;
  int end;
  int start;
  ImVec2 pos;
  ImGuiWindow *window;
  ImGuiContext *g;
  int *out_items_display_end_local;
  int *out_items_display_start_local;
  float items_height_local;
  int items_count_local;
  
  pIVar1 = GImGui->CurrentWindow;
  if ((GImGui->LogEnabled & 1U) == 0) {
    if ((pIVar1->SkipItems & 1U) == 0) {
      start = (int)(pIVar1->DC).CursorPos.y;
      local_3c = (int)(((pIVar1->ClipRect).Min.y - (float)start) / items_height);
      local_40 = (int)(((pIVar1->ClipRect).Max.y - (float)start) / items_height);
      if (((GImGui->NavMoveRequest & 1U) != 0) && (GImGui->NavMoveClipDir == 2)) {
        local_3c = local_3c + -1;
      }
      if (((GImGui->NavMoveRequest & 1U) != 0) && (GImGui->NavMoveClipDir == 3)) {
        local_40 = local_40 + 1;
      }
      mn = ImClamp<int>(local_3c,0,items_count);
      iVar2 = ImClamp<int>(local_40 + 1,mn,items_count);
      *out_items_display_start = mn;
      *out_items_display_end = iVar2;
    }
    else {
      *out_items_display_end = 0;
      *out_items_display_start = 0;
    }
  }
  else {
    *out_items_display_start = 0;
    *out_items_display_end = items_count;
  }
  return;
}

Assistant:

void ImGui::CalcListClipping(int items_count, float items_height, int* out_items_display_start, int* out_items_display_end)
{
    ImGuiContext& g = *GImGui;
    ImGuiWindow* window = g.CurrentWindow;
    if (g.LogEnabled)
    {
        // If logging is active, do not perform any clipping
        *out_items_display_start = 0;
        *out_items_display_end = items_count;
        return;
    }
    if (window->SkipItems)
    {
        *out_items_display_start = *out_items_display_end = 0;
        return;
    }

    const ImVec2 pos = window->DC.CursorPos;
    int start = (int)((window->ClipRect.Min.y - pos.y) / items_height);
    int end = (int)((window->ClipRect.Max.y - pos.y) / items_height);

    // When performing a navigation request, ensure we have one item extra in the direction we are moving to
    if (g.NavMoveRequest && g.NavMoveClipDir == ImGuiDir_Up)
        start--;
    if (g.NavMoveRequest && g.NavMoveClipDir == ImGuiDir_Down)
        end++;

    start = ImClamp(start, 0, items_count);
    end = ImClamp(end + 1, start, items_count);
    *out_items_display_start = start;
    *out_items_display_end = end;
}